

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O1

void __thiscall
Imf_3_4::CompositeDeepScanLine::addSource(CompositeDeepScanLine *this,DeepScanLineInputPart *part)

{
  pointer *pppDVar1;
  Data *pDVar2;
  iterator __position;
  Header *header;
  DeepScanLineInputPart *local_18;
  
  pDVar2 = this->_Data;
  local_18 = part;
  header = DeepScanLineInputPart::header(part);
  Data::check_valid(pDVar2,header);
  pDVar2 = this->_Data;
  __position._M_current =
       (pDVar2->_part).
       super__Vector_base<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pDVar2->_part).
      super__Vector_base<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Imf_3_4::DeepScanLineInputPart*,std::allocator<Imf_3_4::DeepScanLineInputPart*>>::
    _M_realloc_insert<Imf_3_4::DeepScanLineInputPart*const&>
              ((vector<Imf_3_4::DeepScanLineInputPart*,std::allocator<Imf_3_4::DeepScanLineInputPart*>>
                *)&pDVar2->_part,__position,&local_18);
  }
  else {
    *__position._M_current = local_18;
    pppDVar1 = &(pDVar2->_part).
                super__Vector_base<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppDVar1 = *pppDVar1 + 1;
  }
  return;
}

Assistant:

void
CompositeDeepScanLine::addSource (DeepScanLineInputPart* part)
{
    _Data->check_valid (part->header ());
    _Data->_part.push_back (part);
}